

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O3

ecs_table_t *
ecs_table_traverse_remove
          (ecs_world_t *world,ecs_table_t *node,ecs_entities_t *to_remove,ecs_entities_t *removed)

{
  int iVar1;
  int iVar2;
  ecs_entity_t *peVar3;
  ecs_entity_t e;
  ecs_edge_t *peVar4;
  ecs_table_t *peVar5;
  long lVar6;
  ecs_table_t *node_00;
  
  iVar1 = to_remove->count;
  peVar5 = &(world->store).root;
  if (node != (ecs_table_t *)0x0) {
    peVar5 = node;
  }
  if (0 < (long)iVar1) {
    peVar3 = to_remove->array;
    lVar6 = 0;
    node_00 = peVar5;
    do {
      e = peVar3[lVar6];
      _ecs_assert(e != 0,2,(char *)0x0,"e != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                  ,0x220);
      if (e == 0) {
        __assert_fail("e != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                      ,0x220,
                      "ecs_table_t *ecs_table_traverse_remove(ecs_world_t *, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
      peVar4 = get_edge(node_00,e);
      peVar5 = peVar4->remove;
      if (peVar5 == (ecs_table_t *)0x0) {
        peVar5 = node_00;
        if (peVar4->add == node_00) {
          peVar5 = find_or_create_table_exclude(world,node_00,e);
          if (peVar5 == (ecs_table_t *)0x0) {
            return (ecs_table_t *)0x0;
          }
          peVar4->remove = peVar5;
          goto LAB_001271b1;
        }
      }
      else {
LAB_001271b1:
        if ((removed != (ecs_entities_t *)0x0) && (((char)(e >> 0x38) == -4 || (node_00 != peVar5)))
           ) {
          iVar2 = removed->count;
          removed->count = iVar2 + 1;
          removed->array[iVar2] = e;
        }
      }
      lVar6 = lVar6 + 1;
      node_00 = peVar5;
    } while (iVar1 != lVar6);
  }
  return peVar5;
}

Assistant:

ecs_table_t* ecs_table_traverse_remove(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entities_t * to_remove,
    ecs_entities_t * removed)
{
    int32_t i, count = to_remove->count;
    ecs_entity_t *entities = to_remove->array;
    node = node ? node : &world->store.root;

    for (i = 0; i < count; i ++) {
        ecs_entity_t e = entities[i];

        /* Removing 0 from an entity is not valid */
        ecs_assert(e != 0, ECS_INVALID_PARAMETER, NULL);

        ecs_edge_t *edge = get_edge(node, e);
        ecs_table_t *next = edge->remove;

        if (!next) {
            if (edge->add == node) {
                /* Find table with all components of node except 'e' */
                next = find_or_create_table_exclude(world, node, e);
                if (!next) {
                    return NULL;
                }

                edge->remove = next;
            } else {
                /* If the add edge does not point to self, the table
                 * does not have the entity in to_remove. */
                continue;
            }
        }

        bool has_case = ECS_HAS_ROLE(e, CASE);
        if (removed && (node != next || has_case)) {
            removed->array[removed->count ++] = e; 
        }

        node = next;
    }    

    return node;
}